

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

void __thiscall
embree::TutorialBenchmark::registerBenchmark
          (TutorialBenchmark *this,string *name,int argc,char **argv)

{
  ostream *poVar1;
  BenchState benchState;
  BenchState local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BENCHMARK SCENE: ",0x11)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  (*this->func)(&local_30,&this->params,argc,argv);
  return;
}

Assistant:

void TutorialBenchmark::registerBenchmark(std::string const& name, int argc, char** argv)
{
#ifdef USE_GOOGLE_BENCHMARK
  if (params.legacy) {
    std::cout << "BENCHMARK SCENE: " << name << std::endl;
    BenchState benchState;
    func(benchState, params, argc, argv);
  }
  else {
    ::benchmark::RegisterBenchmark(name.c_str(), callBenchFunc, argc, argv, params, func)->Unit(::benchmark::TimeUnit::kMillisecond);
  }
#else
  std::cout << "BENCHMARK SCENE: " << name << std::endl;
  BenchState benchState;
  func(benchState, params, argc, argv);
#endif
}